

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  tm *ptVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  undefined8 uVar12;
  tm time_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  int local_8c;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  int local_54;
  
  local_270._M_dataplus._M_p = (pointer)((long)this / 1000);
  ptVar4 = localtime_r((time_t *)&local_270,(tm *)&local_68);
  if (ptVar4 == (tm *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return extraout_RAX;
  }
  local_8c = local_54 + 0x76c;
  StreamableToString<int>((string *)local_88,&local_8c);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((string *)local_88,"-");
  paVar1 = &local_1d0.field_2;
  local_1d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p == paVar7) {
    local_1d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_1d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_1d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1d0.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_1d0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_(&local_b0,(String *)(ulong)(local_58 + 1),2,(int)paVar7);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    uVar12 = local_1d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_b0._M_string_length + local_1d0._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar12 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_b0._M_string_length + local_1d0._M_string_length) goto LAB_0013d653;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_b0,0,(char *)0x0,(ulong)local_1d0._M_dataplus._M_p);
  }
  else {
LAB_0013d653:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1d0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if (paVar8 == paVar7) {
    local_250.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_250.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_250._M_dataplus._M_p = (pointer)paVar8;
  }
  local_250._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  paVar7->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_250,"-");
  paVar7 = &local_1b0.field_2;
  local_1b0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p == paVar8) {
    local_1b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_1b0._M_dataplus._M_p = (pointer)paVar7;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_1b0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_(&local_d0,(String *)(ulong)(uint)local_68._12_4_,2,(int)paVar8)
  ;
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar7) {
    uVar12 = local_1b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_d0._M_string_length + local_1b0._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar12 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_d0._M_string_length + local_1b0._M_string_length) goto LAB_0013d790;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b0._M_dataplus._M_p);
  }
  else {
LAB_0013d790:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1b0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if (paVar9 == paVar8) {
    local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_230.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_230.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_230._M_dataplus._M_p = (pointer)paVar9;
  }
  local_230._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_230,"T");
  paVar8 = &local_190.field_2;
  local_190._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar9 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p == paVar9) {
    local_190.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_190._M_dataplus._M_p = (pointer)paVar8;
  }
  else {
    local_190.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_190._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_(&local_f0,(String *)(ulong)(uint)local_68._8_4_,2,(int)paVar9);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar8) {
    uVar12 = local_190.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_f0._M_string_length + local_190._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f0._M_string_length + local_190._M_string_length) goto LAB_0013d8cf;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_f0,0,(char *)0x0,(ulong)local_190._M_dataplus._M_p);
  }
  else {
LAB_0013d8cf:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_190,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar5->_M_dataplus)._M_p;
  paVar9 = &pbVar5->field_2;
  if (paVar10 == paVar9) {
    local_210.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_210.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_210.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_210._M_dataplus._M_p = (pointer)paVar10;
  }
  local_210._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar5->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_210,":");
  paVar9 = &local_170.field_2;
  local_170._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar10 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == paVar10) {
    local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_170.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_170._M_dataplus._M_p = (pointer)paVar9;
  }
  else {
    local_170.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_170._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_110,(String *)(ulong)(uint)local_68._M_allocated_capacity._4_4_,2,(int)paVar10);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar9) {
    uVar12 = local_170.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_110._M_string_length + local_170._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar12 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_110._M_string_length + local_170._M_string_length) goto LAB_0013da0d;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::replace
                       ((ulong)&local_110,0,(char *)0x0,(ulong)local_170._M_dataplus._M_p);
  }
  else {
LAB_0013da0d:
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_170,local_110._M_dataplus._M_p,local_110._M_string_length);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar5->_M_dataplus)._M_p;
  paVar10 = &pbVar5->field_2;
  if (paVar11 == paVar10) {
    local_1f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_1f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1f0._M_dataplus._M_p = (pointer)paVar11;
  }
  local_1f0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar5->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_1f0,":");
  paVar10 = &local_150.field_2;
  local_150._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar11 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p == paVar11) {
    local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_150.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_150._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_150.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_150._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  String::FormatIntWidthN_abi_cxx11_
            (&local_130,(String *)(ulong)(uint)local_68._M_allocated_capacity._0_4_,2,(int)paVar11);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    uVar12 = local_150.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_130._M_string_length + local_150._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar12 = local_130.field_2._M_allocated_capacity;
    }
    if (local_130._M_string_length + local_150._M_string_length <= (ulong)uVar12) {
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::__cxx11::string::replace
                         ((ulong)&local_130,0,(char *)0x0,(ulong)local_150._M_dataplus._M_p);
      goto LAB_0013db79;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_150,local_130._M_dataplus._M_p,local_130._M_string_length);
LAB_0013db79:
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar11 = &pbVar5->field_2;
  if (paVar2 == paVar11) {
    local_270.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_270.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_270._M_dataplus._M_p = (pointer)paVar2;
  }
  local_270._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar5->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_270,"Z");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (pbVar5->_M_dataplus)._M_p;
  paVar11 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar11) {
    uVar12 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar11->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar12;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar10) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != paVar9) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != paVar8) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != paVar7) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  psVar6 = (string *)(local_88 + 0x10);
  if ((string *)local_88._0_8_ != psVar6) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    psVar6 = extraout_RAX_00;
  }
  return psVar6;
}

Assistant:

static std::string FormatEpochTimeInMillisAsRFC3339(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "Z";
}